

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::printSwitch(JSPrinter *this,Ref node)

{
  bool bVar1;
  Ref *pRVar2;
  size_t sVar3;
  size_t i;
  ulong uVar4;
  Ref local_48;
  Ref node_local;
  Ref c;
  Ref cases;
  
  local_48.inst = node.inst;
  emit(this,"switch");
  space(this);
  emit(this,'(');
  pRVar2 = Ref::operator[](&local_48,1);
  print(this,pRVar2->inst);
  emit(this,')');
  space(this);
  emit(this,'{');
  newline(this);
  pRVar2 = Ref::operator[](&local_48,2);
  c.inst = pRVar2->inst;
  uVar4 = 0;
  do {
    sVar3 = cashew::Value::size(c.inst);
    if (sVar3 <= uVar4) {
      emit(this,'}');
      return;
    }
    pRVar2 = Ref::operator[](&c,(uint)uVar4);
    node_local.inst = pRVar2->inst;
    pRVar2 = Ref::operator[](&node_local,0);
    bVar1 = Ref::operator!(pRVar2);
    if (bVar1) {
      emit(this,"default:");
    }
    else {
      emit(this,"case ");
      pRVar2 = Ref::operator[](&node_local,0);
      print(this,pRVar2->inst);
      emit(this,':');
    }
    pRVar2 = Ref::operator[](&node_local,1);
    sVar3 = cashew::Value::size(pRVar2->inst);
    if (sVar3 == 0) {
LAB_0077c60f:
      newline(this);
    }
    else {
      this->indent = this->indent + 1;
      newline(this);
      sVar3 = this->used;
      pRVar2 = Ref::operator[](&node_local,1);
      printStats(this,pRVar2->inst);
      this->indent = this->indent + -1;
      if (sVar3 != this->used) goto LAB_0077c60f;
      this->used = sVar3 - 1;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void printSwitch(Ref node) {
    emit("switch");
    space();
    emit('(');
    print(node[1]);
    emit(')');
    space();
    emit('{');
    newline();
    Ref cases = node[2];
    for (size_t i = 0; i < cases->size(); i++) {
      Ref c = cases[i];
      if (!c[0]) {
        emit("default:");
      } else {
        emit("case ");
        print(c[0]);
        emit(':');
      }
      if (c[1]->size() > 0) {
        indent++;
        newline();
        auto curr = used;
        printStats(c[1]);
        indent--;
        if (curr != used) {
          newline();
        } else {
          used--; // avoid the extra indentation we added tentatively
        }
      } else {
        newline();
      }
    }
    emit('}');
  }